

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bottlecreatorgenerator.cpp
# Opt level: O1

string * __thiscall
BottleCreatorGenerator::getFieldType_abi_cxx11_
          (string *__return_storage_ptr__,BottleCreatorGenerator *this,int fieldIndex)

{
  pointer pbVar1;
  pointer pcVar2;
  ulong uVar3;
  
  uVar3 = (ulong)fieldIndex;
  pbVar1 = (this->fieldsType_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar3 < (ulong)((long)(this->fieldsType_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = pbVar1[uVar3]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + pbVar1[uVar3]._M_string_length);
    return __return_storage_ptr__;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

std::string BottleCreatorGenerator::getFieldType(int fieldIndex) {
    return fieldsType_.at(fieldIndex);
}